

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void __thiscall Console::Prompt::Private::handleInput(Private *this,char *input,usize len)

{
  conchar character;
  
  character = (conchar)(byte)*input;
  if (*input == 0x1b) {
    if (input[1] == '[') {
      switch(input[2]) {
      case 'A':
        promptHistoryUp(this);
        return;
      case 'B':
        promptHistoryDown(this);
        return;
      case 'C':
        promptMoveRight(this);
        return;
      case 'D':
        promptMoveLeft(this);
        return;
      case 'E':
      case 'G':
        break;
      case 'F':
        promptMoveEnd(this);
        return;
      case 'H':
        promptMoveHome(this);
        return;
      default:
        if ((input[2] == '3') && (input[3] == '~')) {
          promptRemoveNext(this);
          return;
        }
      }
    }
  }
  else {
    if (this->utf8 == true) {
      character = Unicode::fromString(input,len);
    }
    if (character == 8) {
LAB_001062a9:
      promptRemove(this);
      return;
    }
    if (character != 9) {
      if (character == 0x7f) goto LAB_001062a9;
      if (character != 0xd) {
        promptInsert(this,character);
        return;
      }
      this->inputComplete = true;
    }
  }
  return;
}

Assistant:

void handleInput(char* input, usize len)
  {
    if(*input == '\x1b')
    {
      if(input[1] == '[')
        switch(input[2])
        {
        case 'A': // up
          promptHistoryUp();
          break;
        case 'B': // down
          promptHistoryDown();
          break;
        case 'C': // right
          promptMoveRight();
          break;
        case 'D': // left
          promptMoveLeft();
          break;
        case 'H': // home
          promptMoveHome();
          break;
        case 'F': // end
          promptMoveEnd();
          break;
        case '3':
          if(input[3] == '~') // del
            promptRemoveNext();
          break;
        }
    }
    else
    {
      uint32 ch = utf8 ? Unicode::fromString(input, len) : *(uchar*)input;
      switch(ch)
      {
      case '\t':
        break;
      case '\r':
        inputComplete = true;
        break;
      case '\b': // backspace
      case 127: // del
        promptRemove();
        break;
      default:
        promptInsert(ch);
      }
    }
  }